

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

void enet_host_bandwidth_throttle(ENetHost *host)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  undefined1 local_68 [4];
  enet_uint32 peerBandwidth;
  ENetProtocol command;
  ENetPeer *peer;
  int needsAdjustment;
  enet_uint32 bandwidthLimit;
  enet_uint32 throttle;
  enet_uint32 bandwidth;
  enet_uint32 dataTotal;
  enet_uint32 peersRemaining;
  enet_uint32 elapsedTime;
  enet_uint32 timeCurrent;
  ENetHost *host_local;
  
  _elapsedTime = host;
  peersRemaining = enet_time_get();
  dataTotal = peersRemaining - _elapsedTime->bandwidthThrottleEpoch;
  bandwidth = (enet_uint32)_elapsedTime->connectedPeers;
  throttle = 0xffffffff;
  bandwidthLimit = 0xffffffff;
  needsAdjustment = 0;
  peer._4_4_ = 0;
  bVar3 = _elapsedTime->bandwidthLimitedPeers != 0;
  if ((999 < dataTotal) && (_elapsedTime->bandwidthThrottleEpoch = peersRemaining, bandwidth != 0))
  {
    if (_elapsedTime->outgoingBandwidth != 0) {
      throttle = 0;
      bandwidthLimit = (_elapsedTime->outgoingBandwidth * dataTotal) / 1000;
      for (command._40_8_ = _elapsedTime->peers;
          (ulong)command._40_8_ < _elapsedTime->peers + _elapsedTime->peerCount;
          command._40_8_ = command._40_8_ + 0x1c8) {
        if ((*(int *)(command._40_8_ + 0x38) == 5) || (*(int *)(command._40_8_ + 0x38) == 6)) {
          throttle = *(int *)(command._40_8_ + 100) + throttle;
        }
      }
    }
    while( true ) {
      bVar1 = false;
      if (bandwidth != 0) {
        bVar1 = bVar3;
      }
      if (!bVar1) break;
      bVar3 = false;
      if (bandwidthLimit < throttle) {
        needsAdjustment = (bandwidthLimit << 5) / throttle;
      }
      else {
        needsAdjustment = 0x20;
      }
      for (command._40_8_ = _elapsedTime->peers;
          (ulong)command._40_8_ < _elapsedTime->peers + _elapsedTime->peerCount;
          command._40_8_ = command._40_8_ + 0x1c8) {
        if ((((*(int *)(command._40_8_ + 0x38) == 5) || (*(int *)(command._40_8_ + 0x38) == 6)) &&
            (*(int *)(command._40_8_ + 0x50) != 0)) &&
           ((*(enet_uint32 *)(command._40_8_ + 0x5c) != peersRemaining &&
            (uVar2 = (*(int *)(command._40_8_ + 0x50) * dataTotal) / 1000,
            uVar2 < (uint)(needsAdjustment * *(int *)(command._40_8_ + 100)) >> 5)))) {
          *(uint *)(command._40_8_ + 0x90) = (uVar2 << 5) / *(uint *)(command._40_8_ + 100);
          if (*(int *)(command._40_8_ + 0x90) == 0) {
            *(undefined4 *)(command._40_8_ + 0x90) = 1;
          }
          if (*(uint *)(command._40_8_ + 0x90) < *(uint *)(command._40_8_ + 0x8c)) {
            *(undefined4 *)(command._40_8_ + 0x8c) = *(undefined4 *)(command._40_8_ + 0x90);
          }
          *(enet_uint32 *)(command._40_8_ + 0x5c) = peersRemaining;
          *(undefined4 *)(command._40_8_ + 0x60) = 0;
          *(undefined4 *)(command._40_8_ + 100) = 0;
          bVar3 = true;
          bandwidth = bandwidth - 1;
          bandwidthLimit = bandwidthLimit - uVar2;
          throttle = throttle - uVar2;
        }
      }
    }
    if (bandwidth != 0) {
      if (bandwidthLimit < throttle) {
        needsAdjustment = (bandwidthLimit << 5) / throttle;
      }
      else {
        needsAdjustment = 0x20;
      }
      for (command._40_8_ = _elapsedTime->peers;
          (ulong)command._40_8_ < _elapsedTime->peers + _elapsedTime->peerCount;
          command._40_8_ = command._40_8_ + 0x1c8) {
        if (((*(int *)(command._40_8_ + 0x38) == 5) || (*(int *)(command._40_8_ + 0x38) == 6)) &&
           (*(enet_uint32 *)(command._40_8_ + 0x5c) != peersRemaining)) {
          *(int *)(command._40_8_ + 0x90) = needsAdjustment;
          if (*(uint *)(command._40_8_ + 0x90) < *(uint *)(command._40_8_ + 0x8c)) {
            *(undefined4 *)(command._40_8_ + 0x8c) = *(undefined4 *)(command._40_8_ + 0x90);
          }
          *(undefined4 *)(command._40_8_ + 0x60) = 0;
          *(undefined4 *)(command._40_8_ + 100) = 0;
        }
      }
    }
    if (_elapsedTime->recalculateBandwidthLimits != 0) {
      _elapsedTime->recalculateBandwidthLimits = 0;
      bandwidth = (enet_uint32)_elapsedTime->connectedPeers;
      bandwidthLimit = _elapsedTime->incomingBandwidth;
      peer._0_4_ = 1;
      if (bandwidthLimit == 0) {
        peer._4_4_ = 0;
      }
      else {
        while (bandwidth != 0 && (int)peer != 0) {
          peer._0_4_ = 0;
          peer._4_4_ = bandwidthLimit / bandwidth;
          for (command._40_8_ = _elapsedTime->peers;
              (ulong)command._40_8_ < _elapsedTime->peers + _elapsedTime->peerCount;
              command._40_8_ = command._40_8_ + 0x1c8) {
            if (((*(int *)(command._40_8_ + 0x38) == 5) || (*(int *)(command._40_8_ + 0x38) == 6))
               && ((*(enet_uint32 *)(command._40_8_ + 0x58) != peersRemaining &&
                   ((*(int *)(command._40_8_ + 0x54) == 0 ||
                    (*(uint *)(command._40_8_ + 0x54) < peer._4_4_)))))) {
              *(enet_uint32 *)(command._40_8_ + 0x58) = peersRemaining;
              peer._0_4_ = 1;
              bandwidth = bandwidth - 1;
              bandwidthLimit = bandwidthLimit - *(int *)(command._40_8_ + 0x54);
            }
          }
        }
      }
      for (command._40_8_ = _elapsedTime->peers;
          (ulong)command._40_8_ < _elapsedTime->peers + _elapsedTime->peerCount;
          command._40_8_ = command._40_8_ + 0x1c8) {
        if ((*(int *)(command._40_8_ + 0x38) == 5) || (*(int *)(command._40_8_ + 0x38) == 6)) {
          local_68[0] = 0x8a;
          local_68[1] = 0xff;
          command.header = (ENetProtocolCommandHeader)htonl(_elapsedTime->outgoingBandwidth);
          if (*(enet_uint32 *)(command._40_8_ + 0x58) == peersRemaining) {
            peerBandwidth = htonl(*(uint32_t *)(command._40_8_ + 0x54));
          }
          else {
            peerBandwidth = htonl(peer._4_4_);
          }
          enet_peer_queue_outgoing_command
                    ((ENetPeer *)command._40_8_,(ENetProtocol *)local_68,(ENetPacket *)0x0,0,0);
        }
      }
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
            ++ peer)
        {
            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            enet_uint32 peerBandwidth;
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

        for (peer = host -> peers;
             peer < & host -> peers [host -> peerCount];
             ++ peer)
        {
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peer -> packetThrottleLimit = throttle;

            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
        }
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

           for (peer = host -> peers;
                peer < & host -> peers [host -> peerCount];
                ++ peer)
           {
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (peer = host -> peers;
            peer < & host -> peers [host -> peerCount];
            ++ peer)
       {
           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}